

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_print.h
# Opt level: O2

void Color::print_error(string *out)

{
  ostream *poVar1;
  Modifier reset;
  Modifier bold;
  Modifier red;
  Modifier local_24;
  Modifier local_20;
  Modifier local_1c;
  
  local_24.code = RESET;
  local_1c.code = FG_RED;
  local_20.code = BOLD;
  poVar1 = operator<<((ostream *)&std::cout,&local_1c);
  poVar1 = operator<<(poVar1,&local_20);
  poVar1 = std::operator<<(poVar1,"[ ERROR      ] ");
  poVar1 = std::operator<<(poVar1,(string *)out);
  poVar1 = operator<<(poVar1,&local_24);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

inline void print_error(const std::string &out) {
  Color::Modifier red(Color::FG_RED);
  Color::Modifier bold(Color::BOLD);
  Color::Modifier reset(Color::RESET);
  std::cout << red << bold << "[ ERROR      ] "
            << out << reset << std::endl;
}